

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_392279::MLKEMTest_Iterate768_Test::TestBody(MLKEMTest_Iterate768_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_c8 [3];
  Message local_b0;
  Span<const_unsigned_char> local_a8;
  Bytes local_98;
  Span<const_unsigned_char> local_88;
  Bytes local_78;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  uint8_t kExpected [32];
  uint8_t result [32];
  MLKEMTest_Iterate768_Test *this_local;
  
  IteratedTest<MLKEM768_public_key,_1184UL,_MLKEM768_private_key,_2400UL,_&(anonymous_namespace)::wrapper_768_generate_key_external_seed,_&MLKEM768_public_from_private,_&(anonymous_namespace)::wrapper_768_marshal_private_key,_1088UL,_&(anonymous_namespace)::wrapper_768_encap_external_entropy,_&MLKEM768_decap>
            (kExpected + 0x18);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x1280113d8dd159f9;
  kExpected[0] = '\x14';
  kExpected[1] = '3';
  kExpected[2] = 0xbf;
  kExpected[3] = '\x0e';
  kExpected[4] = '\x05';
  kExpected[5] = 0xf1;
  kExpected[6] = '\x1e';
  kExpected[7] = 'y';
  kExpected[8] = '\b';
  kExpected[9] = 0xcf;
  kExpected[10] = 0x9d;
  kExpected[0xb] = '\x03';
  kExpected[0xc] = 0xed;
  kExpected[0xd] = 0xc1;
  kExpected[0xe] = 'P';
  kExpected[0xf] = 0xb2;
  kExpected[0x10] = 0xb0;
  kExpected[0x11] = '|';
  kExpected[0x12] = 0xb9;
  kExpected[0x13] = '\v';
  kExpected[0x14] = 0xef;
  kExpected[0x15] = '[';
  kExpected[0x16] = 0xc1;
  kExpected[0x17] = 0xc1;
  bssl::Span<unsigned_char_const>::Span<32ul>
            ((Span<unsigned_char_const> *)&local_88,(uchar (*) [32])(kExpected + 0x18));
  Bytes::Bytes(&local_78,local_88);
  bssl::Span<unsigned_char_const>::Span<32ul>
            ((Span<unsigned_char_const> *)&local_a8,(uchar (*) [32])&gtest_ar.message_);
  Bytes::Bytes(&local_98,local_a8);
  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
            ((EqHelper *)local_68,"Bytes(result)","Bytes(kExpected)",&local_78,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
               ,0x1fb,message);
    testing::internal::AssertHelper::operator=(local_c8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST(MLKEMTest, Iterate768) {
  // The structure of this test is taken from
  // https://github.com/C2SP/CCTV/blob/main/ML-KEM/README.md?ref=words.filippo.io#accumulated-pq-crystals-vectors
  // but the final value has been updated to reflect the change from Kyber to
  // ML-KEM.
  uint8_t result[32];
  IteratedTest<MLKEM768_public_key, MLKEM768_PUBLIC_KEY_BYTES,
               MLKEM768_private_key, BCM_MLKEM768_PRIVATE_KEY_BYTES,
               wrapper_768_generate_key_external_seed,
               MLKEM768_public_from_private, wrapper_768_marshal_private_key,
               MLKEM768_CIPHERTEXT_BYTES, wrapper_768_encap_external_entropy,
               MLKEM768_decap>(result);

  const uint8_t kExpected[32] = {
      0xf9, 0x59, 0xd1, 0x8d, 0x3d, 0x11, 0x80, 0x12, 0x14, 0x33, 0xbf,
      0x0e, 0x05, 0xf1, 0x1e, 0x79, 0x08, 0xcf, 0x9d, 0x03, 0xed, 0xc1,
      0x50, 0xb2, 0xb0, 0x7c, 0xb9, 0x0b, 0xef, 0x5b, 0xc1, 0xc1};
  EXPECT_EQ(Bytes(result), Bytes(kExpected));
}